

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.h
# Opt level: O2

bool __thiscall FIX::FieldMap::getFieldIfSet(FieldMap *this,FieldBase *field)

{
  FieldBase *pFVar1;
  const_iterator rhs;
  
  rhs = findTag(this,field->m_tag);
  pFVar1 = *(FieldBase **)(this + 0x10);
  if (rhs._M_current != pFVar1) {
    FieldBase::operator=(field,rhs._M_current);
  }
  return rhs._M_current != pFVar1;
}

Assistant:

bool getFieldIfSet(FieldBase &field) const {
    Fields::const_iterator foundField = findTag(field.getTag());
    if (foundField == m_fields.end()) {
      return false;
    }
    field = (*foundField);
    return true;
  }